

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O2

void testConsumeComment(void)

{
  FILE *__stream;
  bool bVar1;
  string commentDescriptor;
  string result;
  string local_488;
  regex pattern;
  string emptyString;
  Node node;
  stringstream buffer;
  ostream local_390 [376];
  ifstream file;
  streambuf local_208 [504];
  
  std::ifstream::ifstream(&file,"source/commentTest.html",_S_in);
  std::__cxx11::stringstream::stringstream((stringstream *)&buffer);
  std::ostream::operator<<(local_390,local_208);
  emptyString._M_dataplus._M_p = (pointer)&emptyString.field_2;
  emptyString._M_string_length = 0;
  emptyString.field_2._M_local_buf[0] = '\0';
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            (&pattern,"<!--.*?-->",0x10);
  std::__cxx11::stringbuf::str();
  std::
  regex_replace<std::__cxx11::regex_traits<char>,char,std::char_traits<char>,std::allocator<char>,std::char_traits<char>,std::allocator<char>>
            (&result,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&node,
             &pattern,&emptyString,0);
  std::__cxx11::string::~string((string *)&node);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&commentDescriptor,"<!--",(allocator<char> *)&node);
  test_count = test_count + 1;
  bVar1 = crawler::contains(&commentDescriptor,&result);
  __stream = _stderr;
  if (bVar1) {
    bVar1 = crawler::contains(&commentDescriptor,&result);
    fprintf(__stream,"function %s(): %s:%d  Assertion `%s` failed. expect: %d actual: %d\n",
            "testConsumeComment",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ramsayleung[P]crawler/test.cpp"
            ,0x76,"true == (!crawler::contains(commentDescriptor, result))",1,(ulong)!bVar1);
  }
  else {
    test_pass = test_pass + 1;
  }
  std::__cxx11::stringbuf::str();
  crawler::parse(&node,&local_488);
  std::__cxx11::string::~string((string *)&local_488);
  printNode(&node);
  crawler::Node::~Node(&node);
  std::__cxx11::string::~string((string *)&commentDescriptor);
  std::__cxx11::string::~string((string *)&result);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex(&pattern);
  std::__cxx11::string::~string((string *)&emptyString);
  std::__cxx11::stringstream::~stringstream((stringstream *)&buffer);
  std::ifstream::~ifstream(&file);
  return;
}

Assistant:

void testConsumeComment() {
  std::ifstream file("source/commentTest.html");
  std::stringstream buffer;
  buffer << file.rdbuf();
  std::string emptyString;
  std::regex pattern(R"(<!--.*?-->)");
  std::string result = std::regex_replace(buffer.str(), pattern, emptyString);
  std::string commentDescriptor("<!--");
  ASSERT_TRUE(!crawler::contains(commentDescriptor, result));
  crawler::Node node = crawler::parse(buffer.str());
  printNode(node);
}